

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O0

void __thiscall QToolBar::changeEvent(QToolBar *this,QEvent *event)

{
  Type TVar1;
  QToolBarPrivate *pQVar2;
  QStyle *pQVar3;
  QToolBarLayout *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int metric;
  QToolBarPrivate *d;
  QStyleOptionToolBar opt;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  QSize *in_stack_ffffffffffffff50;
  QAction *pQVar4;
  undefined4 in_stack_ffffffffffffff64;
  QSize *in_stack_ffffffffffffff88;
  QToolBar *in_stack_ffffffffffffff90;
  undefined1 local_60 [88];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QToolBar *)0x6ed065);
  TVar1 = QEvent::type((QEvent *)in_RSI);
  if (TVar1 == WindowTitleChange) {
    pQVar4 = pQVar2->toggleViewAction;
    QWidget::windowTitle(in_RDI);
    QAction::setText((QString *)pQVar4);
    QString::~QString((QString *)0x6ed0d7);
  }
  else if (TVar1 == LayoutDirectionChange) {
    (**(code **)(*(long *)&pQVar2->layout->super_QLayout + 0x70))();
  }
  else if (TVar1 == StyleChange) {
    (**(code **)(*(long *)&pQVar2->layout->super_QLayout + 0x70))();
    if (((pQVar2->super_QWidgetPrivate).field_0x254 & 1) == 0) {
      memset(local_60,0xaa,0x58);
      QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)0x6ed11e);
      (**(code **)(*(long *)in_RDI + 0x1a0))(in_RDI,local_60);
      pQVar3 = QWidget::style((QWidget *)
                              CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      in_stack_ffffffffffffff64 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x3b,local_60,in_RDI)
      ;
      QSize::QSize(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
      setIconSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      (pQVar2->super_QWidgetPrivate).field_0x254 = 0;
      QStyleOptionToolBar::~QStyleOptionToolBar((QStyleOptionToolBar *)0x6ed191);
    }
    QToolBarLayout::updateMarginAndSpacing(in_RSI);
  }
  QWidget::changeEvent((QWidget *)CONCAT44(in_stack_ffffffffffffff64,TVar1),(QEvent *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBar::changeEvent(QEvent *event)
{
    Q_D(QToolBar);
    switch (event->type()) {
    case QEvent::WindowTitleChange:
        d->toggleViewAction->setText(windowTitle());
        break;
    case QEvent::StyleChange:
        d->layout->invalidate();
        if (!d->explicitIconSize) {
            QStyleOptionToolBar opt;
            initStyleOption(&opt);
            const int metric = style()->pixelMetric(QStyle::PM_ToolBarIconSize, &opt, this);
            setIconSize({metric, metric});
            d->explicitIconSize = false;
        }
        d->layout->updateMarginAndSpacing();
        break;
    case QEvent::LayoutDirectionChange:
        d->layout->invalidate();
        break;
    default:
        break;
    }
    QWidget::changeEvent(event);
}